

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

size_t inform_dist_accumulate(inform_dist *dist,int *events,size_t n)

{
  size_t sVar1;
  inform_dist *local_38;
  size_t i;
  int size;
  size_t n_local;
  int *events_local;
  inform_dist *dist_local;
  
  if (((dist == (inform_dist *)0x0) || (events == (int *)0x0)) || (dist->size == 0)) {
    dist_local = (inform_dist *)0x0;
  }
  else {
    sVar1 = dist->size;
    local_38 = (inform_dist *)0x0;
    for (n_local = (size_t)events;
        ((local_38 < n && (*(int *)n_local < (int)sVar1)) && (-1 < *(int *)n_local));
        n_local = n_local + 4) {
      dist->histogram[*(int *)n_local] = dist->histogram[*(int *)n_local] + 1;
      dist->counts = dist->counts + 1;
      local_38 = (inform_dist *)((long)&local_38->histogram + 1);
    }
    dist_local = local_38;
  }
  return (size_t)dist_local;
}

Assistant:

size_t inform_dist_accumulate(inform_dist *dist, int const *events, size_t n)
{
    // if the distribution is invalid or no events were provided
    if (dist == NULL || events == NULL || dist->size == 0)
    {
        return 0;
    }
    // loop over the events and add them to the distribution
    int const size = (int)dist->size;
    size_t i = 0;
    while (i < n)
    {
        if (size <= *events || *events < 0) break;
        dist->histogram[*events] += 1;
        dist->counts += 1;
        ++events;
        ++i;
    }
    return i;
}